

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcol.c
# Opt level: O2

int ffgpxv(fitsfile *fptr,int datatype,long *firstpix,LONGLONG nelem,void *nulval,void *array,
          int *anynul,int *status)

{
  int iVar1;
  long lVar2;
  int naxis;
  LONGLONG tfirstpix [99];
  
  iVar1 = *status;
  if (nelem != 0 && iVar1 < 1) {
    ffgidm(fptr,&naxis,status);
    for (lVar2 = 0; lVar2 < naxis; lVar2 = lVar2 + 1) {
      tfirstpix[lVar2] = firstpix[lVar2];
    }
    ffgpxvll(fptr,datatype,tfirstpix,nelem,nulval,array,anynul,status);
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffgpxv( fitsfile *fptr,   /* I - FITS file pointer                       */
            int  datatype,    /* I - datatype of the value                   */
            long *firstpix,   /* I - coord of first pixel to read (1s based) */
            LONGLONG nelem,   /* I - number of values to read                */
            void *nulval,     /* I - value for undefined pixels              */
            void *array,      /* O - array of values that are returned       */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from the primary array. The datatype of the
  input array is defined by the 2nd argument.  Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  Undefined elements will be set equal to NULVAL, unless NULVAL=0
  in which case no checking for undefined values will be performed.
  ANYNUL is returned with a value of .true. if any pixels are undefined.
*/
{
    LONGLONG tfirstpix[99];
    int naxis, ii;

    if (*status > 0 || nelem == 0)   /* inherit input status value if > 0 */
        return(*status);

    /* get the size of the image */
    ffgidm(fptr, &naxis, status);
    
    for (ii=0; ii < naxis; ii++)
       tfirstpix[ii] = firstpix[ii];

    ffgpxvll(fptr, datatype, tfirstpix, nelem, nulval, array, anynul, status);

    return(*status);
}